

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O0

void testTempContext(string *tempdir)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  ostream *this;
  exr_result_t _test_rv_4;
  exr_result_t _test_rv_3;
  exr_result_t _test_rv_2;
  exr_result_t _test_rv_1;
  exr_result_t _test_rv;
  int pc;
  exr_context_initializer_t cinit;
  exr_context_t c;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  uint uVar5;
  ostream *in_stack_ffffffffffffff48;
  ostream *in_stack_ffffffffffffff50;
  int local_7c;
  undefined8 local_78 [11];
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_10 [2];
  
  uVar5 = (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_10[0] = 0;
  memset(local_78,0,0x68);
  local_78[0] = 0x68;
  local_20 = 0xfffffffe;
  local_1c = 0xbf800000;
  local_7c = -1;
  printf("Testing initial temporary context API\n");
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_temporary_context(0,uVar2);
  if (iVar1 != 3) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3,"\n    expected: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,3);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(3);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,uVar5,
                   in_stack_ffffffffffffff38);
  }
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_temporary_context(local_10,uVar2,0);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,uVar5,
                   in_stack_ffffffffffffff38);
  }
  iVar1 = exr_get_count(local_10[0],&local_7c);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    in_stack_ffffffffffffff50 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(in_stack_ffffffffffffff50,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,uVar5,
                   in_stack_ffffffffffffff38);
  }
  if (local_7c != 1) {
    core_test_fail((char *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,uVar5,
                   in_stack_ffffffffffffff38);
  }
  exr_finish(local_10);
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = exr_start_temporary_context(local_10,uVar2,local_78);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    in_stack_ffffffffffffff48 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    poVar3 = std::operator<<(in_stack_ffffffffffffff48,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,uVar5,
                   in_stack_ffffffffffffff38);
  }
  iVar1 = exr_initialize_required_attr_simple(local_10[0],0,0x780,0x438);
  if (iVar1 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Return Error: (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    poVar3 = std::operator<<(poVar3,") ");
    pcVar4 = (char *)exr_get_default_error_message(iVar1);
    this = std::operator<<(poVar3,pcVar4);
    uVar5 = (uint)((ulong)poVar3 >> 0x20);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    core_test_fail((char *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,uVar5,
                   in_stack_ffffffffffffff38);
  }
  exr_finish(local_10);
  printf("ok.\n");
  return;
}

Assistant:

void testTempContext (const std::string& tempdir)
{
    exr_context_t c = NULL;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    int pc = -1;

    printf ("Testing initial temporary context API\n");

    EXRCORE_TEST_RVAL_FAIL (
        EXR_ERR_INVALID_ARGUMENT,
        exr_start_temporary_context (NULL, tempdir.c_str (), NULL));

    EXRCORE_TEST_RVAL (exr_start_temporary_context (&c, tempdir.c_str (), NULL));
    EXRCORE_TEST_RVAL (exr_get_count (c, &pc));
    EXRCORE_TEST (pc == 1);
    exr_finish (&c);

    EXRCORE_TEST_RVAL (exr_start_temporary_context (
                           &c, tempdir.c_str (), &cinit));
    EXRCORE_TEST_RVAL (exr_initialize_required_attr_simple (
                           c, 0, 1920, 1080, EXR_COMPRESSION_NONE));
    exr_finish (&c);

    printf ("ok.\n");
}